

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O0

void AlphaVectorPlanning::ExportBeliefSet(BeliefSet *B,string *filename)

{
  value_type pJVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  size_type sVar6;
  const_reference ppJVar7;
  ostream *poVar8;
  string *in_RSI;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *in_RDI;
  double dVar9;
  uint s;
  int b;
  int nrB;
  stringstream ss;
  ofstream fp;
  string *in_stack_fffffffffffffbf8;
  E *in_stack_fffffffffffffc00;
  int local_3d8;
  int local_3d4;
  stringstream local_3a8 [16];
  ostream local_398 [392];
  long local_210 [64];
  string *local_10;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_210,pcVar4,_S_out);
  bVar2 = std::ios::operator!((ios *)((long)local_210 + *(long *)(local_210[0] + -0x18)));
  if ((bVar2 & 1) == 0) {
    sVar6 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::size
                      (local_8);
    for (local_3d4 = 0; local_3d4 != (int)sVar6; local_3d4 = local_3d4 + 1) {
      local_3d8 = 0;
      while( true ) {
        ppJVar7 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                  operator[](local_8,(long)local_3d4);
        pJVar1 = *ppJVar7;
        iVar3 = (**(code **)(*(long *)((long)&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8))
                            + 0x70))((long)&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8));
        if (local_3d8 == iVar3) break;
        ppJVar7 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                  operator[](local_8,(long)local_3d4);
        pJVar1 = *ppJVar7;
        dVar9 = (double)(**(code **)(*(long *)((long)&pJVar1->field_0x0 +
                                              *(long *)((long)*pJVar1 + -0xb8)) + 0x48))
                                  ((long)&pJVar1->field_0x0 + *(long *)((long)*pJVar1 + -0xb8),
                                   local_3d8);
        poVar8 = (ostream *)std::ostream::operator<<(local_210,dVar9);
        std::operator<<(poVar8," ");
        local_3d8 = local_3d8 + 1;
      }
      std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::~ofstream(local_210);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_3a8);
  poVar8 = std::operator<<(local_398,"AlphaVectorPlanning::ExportBeliefSet: failed to open file ");
  std::operator<<(poVar8,local_10);
  uVar5 = __cxa_allocate_exception(0x28);
  std::__cxx11::stringstream::str();
  E::E(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  __cxa_throw(uVar5,&E::typeinfo,E::~E);
}

Assistant:

void AlphaVectorPlanning::ExportBeliefSet(const BeliefSet &B,
                                          const string &filename)
{
    ofstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "AlphaVectorPlanning::ExportBeliefSet: failed to open file "
           << filename;
        throw(E(ss.str()));
    }

    int nrB=B.size();
    for(int b=0;b!=nrB;b++)
    {
        for(unsigned int s=0;s!=B[b]->Size();s++)
            fp << B[b]->Get(s) << " ";
        fp << endl;
    }
}